

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderFloat
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  byte *pbVar1;
  uint32 first_byte_or_zero;
  uint first_byte_or_zero_00;
  uint32 *puVar2;
  uint32 *puVar3;
  CodedInputStream *pCVar4;
  uint32 local_34 [2];
  uint32 buffer32;
  
  pCVar4 = this->stream_;
  pbVar1 = pCVar4->buffer_;
  if (pbVar1 < pCVar4->buffer_end_) {
    first_byte_or_zero = (uint32)*pbVar1;
    if ((char)*pbVar1 < '\0') goto LAB_00316b3c;
    pCVar4->buffer_ = pbVar1 + 1;
  }
  else {
    first_byte_or_zero = 0;
LAB_00316b3c:
    first_byte_or_zero = io::CodedInputStream::ReadTagFallback(pCVar4,first_byte_or_zero);
  }
  pCVar4->last_tag_ = first_byte_or_zero;
  local_34[0] = 0;
  if (first_byte_or_zero == 0) goto LAB_00316bb5;
  pCVar4 = this->stream_;
  puVar3 = (uint32 *)pCVar4->buffer_;
  puVar2 = (uint32 *)pCVar4->buffer_end_;
  if ((int)puVar2 - (int)puVar3 < 4) {
    io::CodedInputStream::ReadLittleEndian32Fallback(pCVar4,local_34);
    pCVar4 = this->stream_;
    puVar3 = (uint32 *)pCVar4->buffer_;
    puVar2 = (uint32 *)pCVar4->buffer_end_;
  }
  else {
    local_34[0] = *puVar3;
    puVar3 = puVar3 + 1;
    pCVar4->buffer_ = (uint8 *)puVar3;
  }
  if (puVar3 < puVar2) {
    first_byte_or_zero_00 = (uint)(byte)*puVar3;
    if ((char)(byte)*puVar3 < '\0') goto LAB_00316b9f;
    pCVar4->buffer_ = (byte *)((long)puVar3 + 1);
  }
  else {
    first_byte_or_zero_00 = 0;
LAB_00316b9f:
    first_byte_or_zero_00 = io::CodedInputStream::ReadTagFallback(pCVar4,first_byte_or_zero_00);
  }
  pCVar4->last_tag_ = first_byte_or_zero_00;
LAB_00316bb5:
  (**(code **)(*(long *)field_name.length_ + 0x60))
            (local_34[0],(long *)field_name.length_,type,field_name.ptr_);
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderFloat(const ProtoStreamObjectSource* os,
                                            const google::protobuf::Type& type,
                                            StringPiece field_name,
                                            ObjectWriter* ow) {
  uint32 tag = os->stream_->ReadTag();
  uint32 buffer32 = 0;  // default value of Float wrapper value
  if (tag != 0) {
    os->stream_->ReadLittleEndian32(&buffer32);
    os->stream_->ReadTag();
  }
  ow->RenderFloat(field_name, bit_cast<float>(buffer32));
  return util::Status();
}